

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_uudecode_raw.c
# Opt level: O1

void test_read_filter_uudecode_base64_raw(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *v2;
  archive_entry *ae;
  archive_entry *local_38;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                   ,L'7',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_raw((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",a);
  copy_reference_file("test_read_filter_uudecode_base64_raw.uu");
  wVar2 = archive_read_open_filename(a,"test_read_filter_uudecode_base64_raw.uu",0x29e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L';',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 670)",a)
  ;
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  v2 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
             ,L'=',"LICENSE2.txt","\"LICENSE2.txt\"",v2,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'>',0x8180,"(AE_IFREG | 0600)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'?',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_uudecode_raw.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_uudecode_base64_raw)
{
        struct archive_entry *ae;
        struct archive *a;

	const char *name = "test_read_filter_uudecode_base64_raw.uu";

        assert((a = archive_read_new()) != NULL);
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        copy_reference_file(name);
        assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 670));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("LICENSE2.txt", archive_entry_pathname(ae));
	assertEqualInt((AE_IFREG | 0600), archive_entry_mode(ae));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}